

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

target_ulong helper_precr_sra_r_ph_w_mips64(uint32_t sa,target_ulong rs,target_ulong rt)

{
  undefined8 local_30;
  uint64_t tempA;
  uint64_t tempB;
  target_ulong rt_local;
  target_ulong rs_local;
  uint32_t sa_local;
  
  if (sa == 0) {
    tempA = (rt & 0xffff) << 1;
    local_30 = (rs & 0xffff) << 1;
  }
  else {
    tempA = (uint64_t)(((int)rt >> ((char)sa - 1U & 0x1f)) + 1);
    local_30 = (ulong)(((int)rs >> ((char)sa - 1U & 0x1f)) + 1);
  }
  return (long)(int)((uint)((tempA >> 1 & 0xffff) << 0x10) | (uint)(local_30 >> 1) & 0xffff);
}

Assistant:

target_ulong helper_precr_sra_r_ph_w(uint32_t sa,
                                     target_ulong rs, target_ulong rt)
{
    uint64_t tempB, tempA;

    /* If sa = 0, then (sa - 1) = -1 will case shift error, so we need else. */
    if (sa == 0) {
        tempB = (rt & MIPSDSP_LO) << 1;
        tempA = (rs & MIPSDSP_LO) << 1;
    } else {
        tempB = ((int32_t)rt >> (sa - 1)) + 1;
        tempA = ((int32_t)rs >> (sa - 1)) + 1;
    }
    rt = (((tempB >> 1) & MIPSDSP_LO) << 16) | ((tempA >> 1) & MIPSDSP_LO);

    return (target_long)(int32_t)rt;
}